

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::AdaptEcdsaAdaptor(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::AdaptEcdsaAdaptorRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::SignatureDataResponseStruct(cfd::js::api::AdaptEcdsaAdaptorRequestStruct_const&)>
  ::
  function<cfd::js::api::SignatureDataResponseStruct(&)(cfd::js::api::AdaptEcdsaAdaptorRequestStruct_const&),void>
            ((function<cfd::js::api::SignatureDataResponseStruct(cfd::js::api::AdaptEcdsaAdaptorRequestStruct_const&)>
              *)&local_38,SchnorrApi::AdaptEcdsaAdaptor);
  ExecuteJsonApi<cfd::js::api::json::AdaptEcdsaAdaptorRequest,cfd::js::api::json::SignatureDataResponse,cfd::js::api::AdaptEcdsaAdaptorRequestStruct,cfd::js::api::SignatureDataResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::AdaptEcdsaAdaptorRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::AdaptEcdsaAdaptor(
    const std::string &request_message) {
  return ExecuteJsonApi<
      AdaptEcdsaAdaptorRequest, SignatureDataResponse,
      AdaptEcdsaAdaptorRequestStruct, SignatureDataResponseStruct>(
      request_message, SchnorrApi::AdaptEcdsaAdaptor);
}